

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O2

REF_STATUS ref_adj_add_uniquely(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  uint uVar1;
  REF_STATUS RVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM __ptr;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  REF_INT RVar8;
  long lVar9;
  long lVar10;
  undefined8 uStack_30;
  
  uVar6 = 0xffffffff;
  RVar8 = -1;
  if (-1 < node) {
    uVar6 = 0xffffffff;
    RVar8 = -1;
    if (node < ref_adj->nnode) {
      uVar7 = ref_adj->first[(uint)node];
      uVar6 = 0xffffffff;
      RVar8 = -1;
      if ((long)(int)uVar7 != -1) {
        RVar8 = ref_adj->item[(int)uVar7].ref;
        uVar6 = (ulong)uVar7;
      }
    }
  }
  while ((int)uVar6 != -1) {
    if (RVar8 == reference) {
      return 0;
    }
    uVar6 = (ulong)ref_adj->item[(int)uVar6].next;
    RVar8 = -1;
    if (uVar6 != 0xffffffffffffffff) {
      RVar8 = ref_adj->item[uVar6].ref;
    }
  }
  if (node < 0) {
    return 3;
  }
  uVar7 = ref_adj->nnode;
  if (node < (int)uVar7) {
LAB_00191efb:
    lVar10 = (long)ref_adj->blank;
    if (lVar10 == -1) {
      uVar7 = ref_adj->nitem;
      lVar10 = (long)(int)uVar7;
      if (lVar10 == 0x7fffffff) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x81,
               "ref_adj_add","the number of ref_adj items is too large for int, cannot grow");
        return 1;
      }
      uVar5 = 100;
      if (100 < (int)((double)(int)uVar7 * 0.5)) {
        uVar5 = (int)((double)(int)uVar7 * 0.5);
      }
      uVar1 = uVar7 ^ 0x7fffffff;
      if ((int)uVar5 < (int)(uVar7 ^ 0x7fffffff)) {
        uVar1 = uVar5;
      }
      ref_adj->nitem = uVar1 + uVar7;
      fflush(_stdout);
      __ptr = ref_adj->item;
      if (0 < (long)ref_adj->nitem) {
        __ptr = (REF_ADJ_ITEM)realloc(__ptr,(long)ref_adj->nitem << 3);
        ref_adj->item = __ptr;
      }
      if (__ptr == (REF_ADJ_ITEM)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x88,
               "ref_adj_add","realloc ref_adj->item NULL");
        uVar6 = (ulong)ref_adj->nitem;
        lVar10 = uVar6 * 8;
        uStack_30 = 8;
        goto LAB_0019210a;
      }
      iVar4 = ref_adj->nitem;
      for (lVar9 = lVar10; uVar7 = uVar7 + 1, lVar9 < iVar4; lVar9 = lVar9 + 1) {
        __ptr[lVar9].ref = -1;
        __ptr[lVar9].next = uVar7;
      }
      __ptr[(long)iVar4 + -1].next = -1;
      uVar7 = ref_adj->nnode;
    }
    else {
      __ptr = ref_adj->item;
    }
    ref_adj->blank = __ptr[lVar10].next;
    __ptr[lVar10].ref = reference;
    pRVar3 = ref_adj->first;
    if (node < (int)uVar7) {
      RVar8 = pRVar3[(uint)node];
    }
    else {
      RVar8 = -1;
    }
    __ptr[lVar10].next = RVar8;
    pRVar3[(uint)node] = (REF_INT)lVar10;
    RVar2 = 0;
  }
  else {
    iVar4 = 0;
    if (0 < (int)(node - uVar7)) {
      iVar4 = node - uVar7;
    }
    uVar5 = iVar4 + 100U;
    if ((int)(iVar4 + 100U) <= (int)((double)(int)uVar7 * 0.5)) {
      uVar5 = (int)((double)(int)uVar7 * 0.5);
    }
    uVar1 = uVar7 ^ 0x7fffffff;
    if ((int)uVar5 < (int)(uVar7 ^ 0x7fffffff)) {
      uVar1 = uVar5;
    }
    ref_adj->nnode = uVar1 + uVar7;
    fflush(_stdout);
    pRVar3 = ref_adj->first;
    if (0 < (long)ref_adj->nnode) {
      pRVar3 = (REF_INT *)realloc(pRVar3,(long)ref_adj->nnode << 2);
      ref_adj->first = pRVar3;
    }
    if (pRVar3 != (REF_INT *)0x0) {
      for (lVar10 = (long)(int)uVar7; uVar7 = ref_adj->nnode, lVar10 < (int)uVar7;
          lVar10 = lVar10 + 1) {
        pRVar3[lVar10] = -1;
      }
      goto LAB_00191efb;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x7a,
           "ref_adj_add","realloc ref_adj->first NULL");
    uVar6 = (ulong)ref_adj->nnode;
    lVar10 = uVar6 * 4;
    uStack_30 = 4;
LAB_0019210a:
    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar6 & 0xffffffff,uVar6,
           uStack_30,lVar10);
    RVar2 = 2;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_adj_add_uniquely(REF_ADJ ref_adj, REF_INT node,
                                        REF_INT reference) {
  REF_INT item, ref;

  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    if (ref == reference) {
      return REF_SUCCESS;
    }
  }

  return ref_adj_add(ref_adj, node, reference);
}